

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appInit.cxx
# Opt level: O0

int __thiscall app::App::init(App *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  InitError *pIVar5;
  undefined8 uVar6;
  SDL_Window *pSVar7;
  SDL_Renderer *pSVar8;
  SDL_Texture *pSVar9;
  ulong uVar10;
  Uint32 *pUVar11;
  string local_2e0 [39];
  undefined1 local_2b9;
  string local_2b8 [39];
  undefined1 local_291;
  string local_290 [39];
  undefined1 local_269;
  string local_268 [39];
  undefined1 local_241;
  string local_240 [32];
  uint local_220;
  undefined1 local_219;
  int numDisp;
  undefined1 local_1f1;
  string local_1f0 [32];
  uint local_1d0;
  undefined1 local_1c9;
  int v;
  int local_1a8;
  int initOk;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  App *local_10;
  App *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a8 = SDL_Init(0x30);
  if (local_1a8 != 0) {
    poVar3 = std::operator<<(local_188,"SDL_Init failed with code ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a8);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = (char *)SDL_GetError();
    std::operator<<(poVar3,pcVar4);
    local_1c9 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,(string *)&v);
    local_1c9 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar2 = SDL_GetNumVideoDrivers();
  if (iVar2 < 1) {
    std::operator<<(local_188,"0 drivers found");
    local_219 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,(string *)&numDisp);
    local_219 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar2 = SDL_VideoInit(0);
  local_1d0 = (uint)(iVar2 != 0);
  if (local_1d0 != 0) {
    poVar3 = std::operator<<(local_188,"SDL_VideoInit failed with code ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1d0);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = (char *)SDL_GetError();
    std::operator<<(poVar3,pcVar4);
    local_1f1 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,local_1f0);
    local_1f1 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  iVar2 = SDL_GetNumVideoDisplays();
  local_220 = (uint)(iVar2 < 1);
  if (local_220 != 0) {
    poVar3 = std::operator<<(local_188,"SDL_GetNumVideoDisplays returned ");
    std::ostream::operator<<(poVar3,local_220);
    local_241 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,local_240);
    local_241 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  local_1a8 = SDL_GetCurrentDisplayMode(0,&this->display);
  if (local_1a8 != 0) {
    poVar3 = std::operator<<(local_188,"SDL_GetCurrentDisplayMode failed with code ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a8);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = (char *)SDL_GetError();
    std::operator<<(poVar3,pcVar4);
    local_269 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,local_268);
    local_269 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  uVar6 = std::__cxx11::string::c_str();
  pSVar7 = (SDL_Window *)
           SDL_CreateWindow(uVar6,0x2fff0000,0x2fff0000,(this->display).w,(this->display).h,0x2103);
  this->window = pSVar7;
  if (this->window == (SDL_Window *)0x0) {
    poVar3 = std::operator<<(local_188,"SDL_CreateWindow failed: ");
    pcVar4 = (char *)SDL_GetError();
    std::operator<<(poVar3,pcVar4);
    local_291 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,local_290);
    local_291 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  pSVar8 = (SDL_Renderer *)SDL_CreateRenderer(this->window,0xffffffff,6);
  this->renderer = pSVar8;
  if (this->renderer == (SDL_Renderer *)0x0) {
    poVar3 = std::operator<<(local_188,"SDL_CreateRenderer failed: ");
    pcVar4 = (char *)SDL_GetError();
    std::operator<<(poVar3,pcVar4);
    local_2b9 = 1;
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,local_2b8);
    local_2b9 = 0;
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  pSVar9 = (SDL_Texture *)
           SDL_CreateTexture(this->renderer,0x16362004,0,(this->display).w,(this->display).h);
  this->texture = pSVar9;
  if (this->texture == (SDL_Texture *)0x0) {
    poVar3 = std::operator<<(local_188,"SDL_CreateTexture failed: ");
    pcVar4 = (char *)SDL_GetError();
    std::operator<<(poVar3,pcVar4);
    pIVar5 = (InitError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    error::InitError::InitError(pIVar5,local_2e0);
    __cxa_throw(pIVar5,&error::InitError::typeinfo,error::InitError::~InitError);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((this->display).w * (this->display).h);
  uVar10 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pUVar11 = (Uint32 *)operator_new__(uVar10);
  this->pixels = pUVar11;
  memset(this->pixels,0xff,(long)((this->display).w * (this->display).h) << 2);
  SDL_ShowWindow(this->window);
  iVar2 = std::__cxx11::stringstream::~stringstream(local_198);
  return iVar2;
}

Assistant:

void App::init() throw (error::InitError)
{
     std::stringstream ss;

     int initOk = SDL_Init(SDL_INIT_VIDEO|SDL_INIT_AUDIO);

     if (initOk != 0) {
          ss << "SDL_Init failed with code " << initOk
             << ": " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     if (SDL_GetNumVideoDrivers() > 0) {
          if (int v = SDL_VideoInit(NULL) != 0) {
               ss << "SDL_VideoInit failed with code " << v
                  << ": " << SDL_GetError();

               throw error::InitError(ss.str());
          }
     } else {
          ss << "0 drivers found";

          throw error::InitError(ss.str());
     }

     if(int numDisp = SDL_GetNumVideoDisplays() < 1) {
          ss << "SDL_GetNumVideoDisplays returned " << numDisp;

          throw error::InitError(ss.str());
     }

     initOk = SDL_GetCurrentDisplayMode(0, &display);
     if (initOk != 0) {
          ss << "SDL_GetCurrentDisplayMode failed with code " << initOk
             << ": " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     window = SDL_CreateWindow(title.c_str(),
                               SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED,
                               display.w, display.h,
                               SDL_WINDOW_FULLSCREEN |
                               SDL_WINDOW_ALLOW_HIGHDPI |
                               SDL_WINDOW_OPENGL |
                               SDL_WINDOW_INPUT_GRABBED);
     if (window == NULL) {
          ss << "SDL_CreateWindow failed: " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     renderer = SDL_CreateRenderer(window, -1,
                                   SDL_RENDERER_ACCELERATED |
                                   SDL_RENDERER_PRESENTVSYNC);
     if (renderer == NULL) {
          ss << "SDL_CreateRenderer failed: " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     texture = SDL_CreateTexture(
          renderer,
          SDL_PIXELFORMAT_ARGB8888, SDL_TEXTUREACCESS_STATIC,
          display.w, display.h);
     if (texture == NULL) {
          ss << "SDL_CreateTexture failed: " << SDL_GetError();

          throw error::InitError(ss.str());
     }

     pixels = new Uint32[display.w * display.h];
     memset(pixels, 255, display.w * display.h * sizeof(Uint32));

     SDL_ShowWindow(window);
}